

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.h
# Opt level: O0

void __thiscall pbrt::ParsedParameter::ParsedParameter(ParsedParameter *this,FileLoc loc)

{
  string *in_RDI;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff70;
  polymorphic_allocator<unsigned_char> *this_00;
  polymorphic_allocator<unsigned_char> local_38;
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  polymorphic_allocator<int> local_28 [3];
  polymorphic_allocator<float> local_10 [2];
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  *(undefined8 *)(in_RDI + 0x50) = in_stack_00000018;
  *(undefined8 *)(in_RDI + 0x40) = in_stack_00000008;
  *(undefined8 *)(in_RDI + 0x48) = in_stack_00000010;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
            ((polymorphic_allocator<float> *)in_stack_ffffffffffffff70);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x58),local_10);
  pstd::pmr::polymorphic_allocator<int>::polymorphic_allocator
            ((polymorphic_allocator<int> *)in_stack_ffffffffffffff70);
  pstd::vector<int,_pstd::pmr::polymorphic_allocator<int>_>::vector
            ((vector<int,_pstd::pmr::polymorphic_allocator<int>_> *)(in_RDI + 0x78),local_28);
  pstd::pmr::
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::polymorphic_allocator(in_stack_ffffffffffffff70);
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(in_RDI + 0x98),&local_30);
  this_00 = &local_38;
  pstd::pmr::polymorphic_allocator<unsigned_char>::polymorphic_allocator(this_00);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
             (in_RDI + 0xb8),this_00);
  in_RDI[0xd8] = (string)0x0;
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  in_RDI[0xe8] = (string)0x0;
  return;
}

Assistant:

ParsedParameter(FileLoc loc) : loc(loc) {}